

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void build_rgb_y_table(j_decompress_ptr cinfo)

{
  jpeg_color_deconverter *pjVar1;
  _func_void_j_decompress_ptr *p_Var2;
  long local_28;
  INT32 i;
  INT32 *rgb_y_tab;
  my_cconvert_ptr cconvert;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->cconvert;
  p_Var2 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x1800);
  pjVar1[3].start_pass = p_Var2;
  for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
    *(long *)(p_Var2 + local_28 * 8) = local_28 * 0x4c8b;
    *(long *)(p_Var2 + local_28 * 8 + 0x800) = local_28 * 0x9646;
    *(long *)(p_Var2 + local_28 * 8 + 0x1000) = local_28 * 0x1d2f + 0x8000;
  }
  return;
}

Assistant:

LOCAL(void)
build_rgb_y_table (j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  INT32 * rgb_y_tab;
  INT32 i;

  /* Allocate and fill in the conversion tables. */
  cconvert->rgb_y_tab = rgb_y_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(TABLE_SIZE * SIZEOF(INT32)));

  for (i = 0; i <= MAXJSAMPLE; i++) {
    rgb_y_tab[i+R_Y_OFF] = FIX(0.29900) * i;
    rgb_y_tab[i+G_Y_OFF] = FIX(0.58700) * i;
    rgb_y_tab[i+B_Y_OFF] = FIX(0.11400) * i + ONE_HALF;
  }
}